

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_parser.cpp
# Opt level: O0

double __thiscall Fossilize::CLIParser::next_double(CLIParser *this)

{
  char *pcVar1;
  double dVar2;
  allocator local_39;
  string local_38;
  double val;
  CLIParser *this_local;
  
  val = (double)this;
  if (this->argc == 0) {
    fprintf(_stderr,"Fossilize ERROR: Tried to parse double, but nothing left in arguments.\n");
    fflush(_stderr);
    exit(1);
  }
  pcVar1 = *this->argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,pcVar1,&local_39);
  dVar2 = std::__cxx11::stod(&local_38,(size_t *)0x0);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  this->argc = this->argc + -1;
  this->argv = this->argv + 1;
  return dVar2;
}

Assistant:

double CLIParser::next_double()
{
	if (!argc)
	{
		LOGE("Tried to parse double, but nothing left in arguments.\n");
		exit(EXIT_FAILURE);
	}

	double val = stod(*argv);

	argc--;
	argv++;

	return val;
}